

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bac.h
# Opt level: O0

int Bac_ObjIsCo(Bac_Ntk_t *p,int i)

{
  int iVar1;
  undefined1 local_15;
  int i_local;
  Bac_Ntk_t *p_local;
  
  iVar1 = Bac_ObjIsPo(p,i);
  local_15 = true;
  if (iVar1 == 0) {
    iVar1 = Bac_ObjIsBi(p,i);
    local_15 = iVar1 != 0;
  }
  return (int)local_15;
}

Assistant:

static inline int            Bac_ObjIsCo( Bac_Ntk_t * p, int i )             { return Bac_ObjIsPo(p, i) || Bac_ObjIsBi(p, i);                                              }